

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string_view cmSystemTools::GetSystemName(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  string_view sVar6;
  string_view value;
  RegularExpressionMatch match;
  RegularExpressionMatch RStack_b8;
  
  pcVar4 = GetSystemName::systemName._M_str;
  sVar5 = GetSystemName::systemName._M_len;
  if (GetSystemName()::initialized != '\x01') {
    iVar2 = uname((utsname *)&GetSystemName::uts_name);
    if (iVar2 < 0) {
      pcVar4 = "";
      sVar5 = 0;
    }
    else {
      GetSystemName()::initialized = '\x01';
      GetSystemName::systemName._M_len = strlen(GetSystemName::uts_name.sysname);
      GetSystemName::systemName._M_str = GetSystemName::uts_name.sysname;
      value._M_str = GetSystemName::uts_name.sysname;
      value._M_len = GetSystemName::systemName._M_len;
      bVar1 = cmValue::IsOff(value);
      if (bVar1) {
        GetSystemName::systemName._M_len = 9;
        GetSystemName::systemName._M_str = "UnknownOS";
      }
      if ((GetSystemName()::bsdOsRegex == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetSystemName()::bsdOsRegex), iVar2 != 0)) {
        GetSystemName::bsdOsRegex.regmust = (char *)0x0;
        GetSystemName::bsdOsRegex.program = (char *)0x0;
        GetSystemName::bsdOsRegex.progsize = 0;
        memset(&GetSystemName::bsdOsRegex,0,0xaa);
        cmsys::RegularExpression::compile(&GetSystemName::bsdOsRegex,"BSD.OS");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetSystemName::bsdOsRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetSystemName()::bsdOsRegex);
      }
      memset(&RStack_b8,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        (&GetSystemName::bsdOsRegex,GetSystemName::uts_name.sysname,&RStack_b8);
      if (bVar1) {
        GetSystemName::systemName._M_len = 5;
        GetSystemName::systemName._M_str = "BSDOS";
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"kFreeBSD",0,8);
      if (sVar3 != 0xffffffffffffffff) {
        GetSystemName::systemName._M_len = 8;
        GetSystemName::systemName._M_str = "kFreeBSD";
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"CYGWIN",0,6);
      if (sVar3 != 0xffffffffffffffff) {
        GetSystemName::systemName._M_len = 6;
        GetSystemName::systemName._M_str = "CYGWIN";
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&GetSystemName::systemName,"MSYS",0,4);
      pcVar4 = GetSystemName::systemName._M_str;
      sVar5 = GetSystemName::systemName._M_len;
      if (sVar3 != 0xffffffffffffffff) {
        GetSystemName::systemName._M_len = 4;
        GetSystemName::systemName._M_str = "MSYS";
        pcVar4 = "MSYS";
        sVar5 = 4;
      }
    }
  }
  sVar6._M_str = pcVar4;
  sVar6._M_len = sVar5;
  return sVar6;
}

Assistant:

cm::string_view cmSystemTools::GetSystemName()
{
#if defined(_WIN32)
  return "Windows";
#elif defined(__ANDROID__)
  return "Android";
#else
  static struct utsname uts_name;
  static bool initialized = false;
  static cm::string_view systemName;
  if (initialized) {
    return systemName;
  }
  if (uname(&uts_name) >= 0) {
    initialized = true;
    systemName = uts_name.sysname;

    if (cmIsOff(systemName)) {
      systemName = "UnknownOS";
    }

    // fix for BSD/OS, remove the /
    static const cmsys::RegularExpression bsdOsRegex("BSD.OS");
    cmsys::RegularExpressionMatch match;
    if (bsdOsRegex.find(uts_name.sysname, match)) {
      systemName = "BSDOS";
    }

    // fix for GNU/kFreeBSD, remove the GNU/
    if (systemName.find("kFreeBSD") != cm::string_view::npos) {
      systemName = "kFreeBSD";
    }

    // fix for CYGWIN and MSYS which have windows version in them
    if (systemName.find("CYGWIN") != cm::string_view::npos) {
      systemName = "CYGWIN";
    }

    if (systemName.find("MSYS") != cm::string_view::npos) {
      systemName = "MSYS";
    }
    return systemName;
  }
  return "";
#endif
}